

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Dropout::backward_impl
          (Dropout *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor m;
  float *in_stack_ffffffffffffff00;
  Dim *in_stack_ffffffffffffff08;
  Tensor *in_stack_ffffffffffffff10;
  Tensor *in_stack_ffffffffffffff18;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff20;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff28;
  
  Tensor::Tensor(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  Tensor::vec(in_stack_ffffffffffffff18);
  Tensor::vec(in_stack_ffffffffffffff18);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
  cwiseProduct<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  Tensor::vec(in_stack_ffffffffffffff18);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator+=
            (in_stack_ffffffffffffff20,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)in_stack_ffffffffffffff18);
  Tensor::~Tensor((Tensor *)0x626da3);
  return;
}

Assistant:

void Dropout::backward_impl(const vector<const Tensor*>& xs,
                       const Tensor& fx,
                       const Tensor& dEdf,
                       unsigned i,
                       Tensor& dEdxi) const {
  Tensor m(dim, (float*)aux_mem);
#ifdef HAVE_CUDA
  gpu::vcwise_product(dEdf.d.size(), dEdf.v, m.v, fx.v);
#else
  dEdxi.vec() += dEdf.vec().cwiseProduct(m.vec());
#endif
}